

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (NameIdPool<xercesc_4_0::XMLNotationDecl> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  XMLSize_t XVar3;
  XMLNotationDecl *pXVar4;
  XMLNotationDecl *data;
  undefined1 local_38 [8];
  NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> e;
  XSerializeEngine *serEng_local;
  NameIdPool<xercesc_4_0::XMLNotationDecl> *objToStore_local;
  
  e.fMemoryManager = (MemoryManager *)serEng;
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    pMVar2 = NameIdPool<xercesc_4_0::XMLNotationDecl>::getMemoryManager(objToStore);
    NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::NameIdPoolEnumerator
              ((NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> *)local_38,objToStore,pMVar2);
    pMVar2 = e.fMemoryManager;
    XVar3 = NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::size
                      ((NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> *)local_38);
    XSerializeEngine::operator<<((XSerializeEngine *)pMVar2,(uint)XVar3);
    while (bVar1 = NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::hasMoreElements
                             ((NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> *)local_38), bVar1
          ) {
      pXVar4 = NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::nextElement
                         ((NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> *)local_38);
      (*(pXVar4->super_XSerializable)._vptr_XSerializable[3])(pXVar4,e.fMemoryManager);
    }
    NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl>::~NameIdPoolEnumerator
              ((NameIdPoolEnumerator<xercesc_4_0::XMLNotationDecl> *)local_38);
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(NameIdPool<XMLNotationDecl>* const objToStore
                                    , XSerializeEngine&                  serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        NameIdPoolEnumerator<XMLNotationDecl> e(objToStore, objToStore->getMemoryManager());

        serEng<<(unsigned int)e.size();

        while (e.hasMoreElements())
        {
            XMLNotationDecl& data = e.nextElement();
            data.serialize(serEng);
        }
    }
}